

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

bool __thiscall
libtorrent::torrent_info::parse_piece_layers(torrent_info *this,bdecode_node *e,error_code *ec)

{
  bool bVar1;
  type_t tVar2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar3;
  int iVar4;
  int iVar5;
  file_storage *this_00;
  size_type sVar6;
  size_type sVar7;
  difference_type dVar8;
  int64_t iVar9;
  pointer ppVar10;
  long lVar11;
  ulong uVar12;
  vector<char,std::allocator<char>> *this_01;
  const_iterator __first;
  const_iterator __last;
  string_view sVar13;
  undefined1 local_268 [8];
  basic_string_view<char,_std::char_traits<char>_> hashes;
  iterator iStack_250;
  int num_pieces;
  int local_244;
  sha256_hash local_240;
  _Self local_220;
  iterator piece_layer;
  file_index_t i_2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_204
  ;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end1_1;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  __begin1_1;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range1_1;
  string_view local_1e0;
  span<const_char> local_1d0;
  digest32<256L> local_1c0;
  _Self local_1a0;
  _Self local_198;
  span<const_char> local_190;
  undefined1 local_180 [8];
  sha256_hash root;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> f;
  int i_1;
  sha256_hash local_f0;
  int local_d0;
  file_index_t local_cc;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_c8;
  file_index_t i;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_bc;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end1;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __begin1;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range1;
  file_storage *fs;
  set<libtorrent::digest32<256L>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
  all_file_roots;
  undefined1 local_58 [8];
  map<libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  piece_layers;
  error_code *ec_local;
  bdecode_node *e_local;
  torrent_info *this_local;
  
  piece_layers._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ec;
  ::std::
  map<libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::map((map<libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
         *)local_58);
  tVar2 = bdecode_node::type(e);
  if (tVar2 == dict_t) {
    ::std::
    set<libtorrent::digest32<256L>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
    ::set((set<libtorrent::digest32<256L>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
           *)&fs);
    this_00 = orig_files(this);
    ___end1 = file_storage::file_range(this_00);
    local_bc = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
               ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                        *)&__end1);
    iVar3 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
            ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                   *)&__end1);
    while( true ) {
      i.m_val = (int)local_bc.m_idx.m_val;
      local_c8 = iVar3.m_idx.m_val;
      bVar1 = libtorrent::operator!=(local_bc,iVar3);
      if (!bVar1) break;
      local_d0 = (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                      ::operator*(&local_bc);
      local_cc.m_val = local_d0;
      iVar9 = file_storage::file_size(this_00,(file_index_t)local_d0);
      iVar5 = file_storage::piece_length(this_00);
      if (iVar5 < iVar9) {
        file_storage::root(&local_f0,this_00,local_cc);
        ::std::
        set<libtorrent::digest32<256L>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
        ::insert((set<libtorrent::digest32<256L>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
                  *)&fs,&local_f0);
      }
      f.second._60_4_ =
           index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
           ::operator++(&local_bc);
    }
    f.second.m_size = 0;
    while( true ) {
      iVar5 = f.second.m_size;
      iVar4 = bdecode_node::dict_size(e);
      if (iVar4 <= iVar5) break;
      bdecode_node::dict_at
                ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
                  *)(root.m_number._M_elems + 6),e,f.second.m_size);
      sVar6 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         (root.m_number._M_elems + 6));
      sVar7 = digest32<256L>::size();
      if (sVar6 == sVar7) {
        tVar2 = bdecode_node::type((bdecode_node *)&f.first._M_str);
        if (tVar2 != string_t) goto LAB_0073d4d4;
        iVar5 = bdecode_node::string_length((bdecode_node *)&f.first._M_str);
        dVar8 = digest32<256L>::size();
        if ((long)iVar5 % dVar8 != 0) goto LAB_0073d4d4;
        span<char_const>::span<std::basic_string_view<char,std::char_traits<char>>,char_const,void>
                  ((span<char_const> *)&local_190,
                   (basic_string_view<char,_std::char_traits<char>_> *)(root.m_number._M_elems + 6))
        ;
        digest32<256L>::digest32((digest32<256L> *)local_180,local_190);
        local_198._M_node =
             (_Base_ptr)
             ::std::
             set<libtorrent::digest32<256L>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
             ::find((set<libtorrent::digest32<256L>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
                     *)&fs,(digest32<256L> *)local_180);
        local_1a0._M_node =
             (_Base_ptr)
             ::std::
             set<libtorrent::digest32<256L>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
             ::end((set<libtorrent::digest32<256L>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
                    *)&fs);
        bVar1 = ::std::operator==(&local_198,&local_1a0);
        if (bVar1) {
          boost::system::error_code::operator=
                    ((error_code *)piece_layers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     torrent_invalid_piece_layer);
          this_local._7_1_ = 0;
          all_file_roots._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
        }
        else {
          span<char_const>::
          span<std::basic_string_view<char,std::char_traits<char>>,char_const,void>
                    ((span<char_const> *)&local_1d0,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     (root.m_number._M_elems + 6));
          digest32<256L>::digest32(&local_1c0,local_1d0);
          sVar13 = bdecode_node::string_value((bdecode_node *)&f.first._M_str);
          local_1e0 = sVar13;
          ::std::
          map<libtorrent::digest32<256l>,std::basic_string_view<char,std::char_traits<char>>,std::less<libtorrent::digest32<256l>>,std::allocator<std::pair<libtorrent::digest32<256l>const,std::basic_string_view<char,std::char_traits<char>>>>>
          ::emplace<libtorrent::digest32<256l>,std::basic_string_view<char,std::char_traits<char>>>
                    ((map<libtorrent::digest32<256l>,std::basic_string_view<char,std::char_traits<char>>,std::less<libtorrent::digest32<256l>>,std::allocator<std::pair<libtorrent::digest32<256l>const,std::basic_string_view<char,std::char_traits<char>>>>>
                      *)local_58,&local_1c0,&local_1e0);
          all_file_roots._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
        }
      }
      else {
LAB_0073d4d4:
        boost::system::error_code::operator=
                  ((error_code *)piece_layers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   torrent_invalid_piece_layer);
        this_local._7_1_ = 0;
        all_file_roots._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      }
      ::std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>::
      ~pair((pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> *
            )(root.m_number._M_elems + 6));
      if (all_file_roots._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0)
      goto LAB_0073da2e;
      f.second.m_size = f.second.m_size + 1;
    }
    iVar5 = file_storage::num_files(this_00);
    libtorrent::aux::
    container_wrapper<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,std::allocator<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>>>>
    ::resize<int,void>((container_wrapper<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>,std::allocator<libtorrent::aux::container_wrapper<char,int,std::vector<char,std::allocator<char>>>>>>
                        *)&this->m_piece_layers,iVar5);
    ___end1_1 = file_storage::file_range(this_00);
    local_204 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                         *)&__end1_1);
    iVar3 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
            ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                   *)&__end1_1);
    while( true ) {
      bVar1 = libtorrent::operator!=(local_204,iVar3);
      if (!bVar1) break;
      piece_layer._M_node._0_4_ =
           index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
           ::operator*(&local_204);
      piece_layer._M_node._4_4_ = piece_layer._M_node._0_4_;
      iVar9 = file_storage::file_size(this_00,(file_index_t)piece_layer._M_node._0_4_);
      iVar5 = file_storage::piece_length(this_00);
      if (iVar5 < iVar9) {
        local_244 = piece_layer._M_node._4_4_;
        file_storage::root(&local_240,this_00,(file_index_t)piece_layer._M_node._4_4_);
        local_220._M_node =
             (_Base_ptr)
             ::std::
             map<libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::find((map<libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     *)local_58,&local_240);
        iStack_250 = ::std::
                     map<libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     ::end((map<libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                            *)local_58);
        bVar1 = ::std::operator==(&local_220,&stack0xfffffffffffffdb0);
        if (!bVar1) {
          hashes._M_str._0_4_ = piece_layer._M_node._4_4_;
          hashes._M_str._4_4_ = file_storage::file_num_pieces(this_00,piece_layer._M_node._4_4_);
          ppVar10 = ::std::
                    _Rb_tree_iterator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::operator->(&local_220);
          sVar6 = ::std::basic_string_view<char,_std::char_traits<char>_>::size(&ppVar10->second);
          lVar11 = (long)hashes._M_str._4_4_;
          dVar8 = digest32<256L>::size();
          if (sVar6 != lVar11 * dVar8) {
            boost::system::error_code::operator=
                      ((error_code *)piece_layers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       torrent_invalid_piece_layer);
            this_local._7_1_ = 0;
            all_file_roots._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
            goto LAB_0073da2e;
          }
          ppVar10 = ::std::
                    _Rb_tree_iterator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::operator->(&local_220);
          local_268 = (undefined1  [8])(ppVar10->second)._M_len;
          hashes._M_len = (size_t)(ppVar10->second)._M_str;
          sVar6 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_268);
          uVar12 = digest32<256L>::size();
          if (sVar6 % uVar12 != 0) {
            boost::system::error_code::operator=
                      ((error_code *)piece_layers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       torrent_invalid_piece_layer);
            this_local._7_1_ = 0;
            all_file_roots._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
            goto LAB_0073da2e;
          }
          this_01 = (vector<char,std::allocator<char>> *)
                    libtorrent::aux::
                    container_wrapper<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>_>
                    ::operator[](&this->m_piece_layers,piece_layer._M_node._4_4_);
          __first = ::std::basic_string_view<char,_std::char_traits<char>_>::begin
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_268);
          __last = ::std::basic_string_view<char,_std::char_traits<char>_>::end
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_268);
          ::std::vector<char,std::allocator<char>>::assign<char_const*,void>(this_01,__first,__last)
          ;
        }
      }
      index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
      operator++(&local_204);
    }
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>::
    operator|=(&this->m_flags,
               (bitfield_flag<unsigned_char,_libtorrent::torrent_info_flags_tag,_void>)'\x10');
    this_local._7_1_ = 1;
    all_file_roots._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
LAB_0073da2e:
    ::std::
    set<libtorrent::digest32<256L>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
    ::~set((set<libtorrent::digest32<256L>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
            *)&fs);
  }
  else {
    boost::system::error_code::operator=
              ((error_code *)piece_layers._M_t._M_impl.super__Rb_tree_header._M_node_count,
               torrent_missing_piece_layer);
    this_local._7_1_ = 0;
    all_file_roots._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  }
  ::std::
  map<libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~map((map<libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *)local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool torrent_info::parse_piece_layers(bdecode_node const& e, error_code& ec)
	{
		std::map<sha256_hash, string_view> piece_layers;

		if (e.type() != bdecode_node::dict_t)
		{
			ec = errors::torrent_missing_piece_layer;
			return false;
		}

		std::set<sha256_hash> all_file_roots;
		auto const& fs = orig_files();
		for (file_index_t i : fs.file_range())
		{
			if (fs.file_size(i) <= fs.piece_length())
				continue;
			all_file_roots.insert(fs.root(i));
		}

		for (int i = 0; i < e.dict_size(); ++i)
		{
			auto const f = e.dict_at(i);
			if (f.first.size() != static_cast<std::size_t>(sha256_hash::size())
				|| f.second.type() != bdecode_node::string_t
				|| f.second.string_length() % sha256_hash::size() != 0)
			{
				ec = errors::torrent_invalid_piece_layer;
				return false;
			}

			sha256_hash const root(f.first);
			if (all_file_roots.find(root) == all_file_roots.end())
			{
				// This piece layer doesn't refer to any file in this torrent
				ec = errors::torrent_invalid_piece_layer;
				return false;
			}

			piece_layers.emplace(sha256_hash(f.first), f.second.string_value());
		}

		m_piece_layers.resize(fs.num_files());

		for (file_index_t i : fs.file_range())
		{
			if (fs.file_size(i) <= fs.piece_length())
				continue;

			auto const piece_layer = piece_layers.find(fs.root(i));
			if (piece_layer == piece_layers.end()) continue;

			int const num_pieces = fs.file_num_pieces(i);

			if (ptrdiff_t(piece_layer->second.size()) != num_pieces * sha256_hash::size())
			{
				ec = errors::torrent_invalid_piece_layer;
				return false;
			}

			auto const hashes = piece_layer->second;
			if ((hashes.size() % sha256_hash::size()) != 0)
			{
				ec = errors::torrent_invalid_piece_layer;
				return false;
			}

			m_piece_layers[i].assign(hashes.begin(), hashes.end());
		}

		m_flags |= v2_has_piece_hashes;
		return true;
	}